

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wasm-metadce.cpp
# Opt level: O1

void __thiscall MetaDCEGraph::printAllUnused(MetaDCEGraph *this)

{
  size_t *__v;
  __node_base_ptr p_Var1;
  ostream *poVar2;
  _Base_ptr p_Var3;
  _Hash_node_base *p_Var4;
  undefined1 local_80 [8];
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  unused;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_40;
  
  unused._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)&unused;
  unused._M_t._M_impl._0_4_ = 0;
  unused._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  unused._M_t._M_impl.super__Rb_tree_header._M_header._4_4_ = 0;
  unused._M_t._M_impl.super__Rb_tree_header._M_header._M_right = (_Base_ptr)0x0;
  p_Var4 = (this->nodes)._M_h._M_before_begin._M_nxt;
  unused._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       unused._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
  if (p_Var4 != (_Hash_node_base *)0x0) {
    __v = &unused._M_t._M_impl.super__Rb_tree_header._M_node_count;
    do {
      p_Var1 = std::
               _Hashtable<wasm::Name,_wasm::Name,_std::allocator<wasm::Name>,_std::__detail::_Identity,_std::equal_to<wasm::Name>,_std::hash<wasm::Name>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
               ::_M_find_before_node
                         (&(this->reached)._M_h,
                          (ulong)p_Var4[2]._M_nxt % (this->reached)._M_h._M_bucket_count,
                          (key_type *)(p_Var4 + 1),(__hash_code)p_Var4[2]._M_nxt);
      if ((p_Var1 == (__node_base_ptr)0x0) || (p_Var1->_M_nxt == (_Hash_node_base *)0x0)) {
        unused._M_t._M_impl.super__Rb_tree_header._M_node_count = (size_t)&local_40;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)__v,p_Var4[2]._M_nxt,
                   (long)&(p_Var4[2]._M_nxt)->_M_nxt + (long)&(p_Var4[1]._M_nxt)->_M_nxt);
        std::
        _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
        ::_M_insert_unique<std::__cxx11::string>
                  ((_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                    *)local_80,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)__v);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)unused._M_t._M_impl.super__Rb_tree_header._M_node_count != &local_40) {
          operator_delete((void *)unused._M_t._M_impl.super__Rb_tree_header._M_node_count,
                          local_40._M_allocated_capacity + 1);
        }
      }
      p_Var4 = p_Var4->_M_nxt;
    } while (p_Var4 != (_Hash_node_base *)0x0);
  }
  if (unused._M_t._M_impl.super__Rb_tree_header._M_header._M_parent != (_Rb_tree_node_base *)&unused
     ) {
    p_Var3 = unused._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
    do {
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"unused: ",8);
      poVar2 = std::__ostream_insert<char,std::char_traits<char>>
                         ((ostream *)&std::cout,*(char **)(p_Var3 + 1),(long)p_Var3[1]._M_parent);
      unused._M_t._M_impl.super__Rb_tree_header._M_node_count =
           CONCAT71(unused._M_t._M_impl.super__Rb_tree_header._M_node_count._1_7_,10);
      std::__ostream_insert<char,std::char_traits<char>>
                (poVar2,(char *)&unused._M_t._M_impl.super__Rb_tree_header._M_node_count,1);
      p_Var3 = (_Base_ptr)std::_Rb_tree_increment(p_Var3);
    } while (p_Var3 != (_Rb_tree_node_base *)&unused);
  }
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~_Rb_tree((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)local_80);
  return;
}

Assistant:

void printAllUnused() {
    std::set<std::string> unused;
    for (auto& [name, _] : nodes) {
      if (reached.find(name) == reached.end()) {
        unused.insert(name.toString());
      }
    }
    for (auto& name : unused) {
      std::cout << "unused: " << name << '\n';
    }
  }